

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_shl(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  TValue *pTVar1;
  int iVar2;
  lua_Integer lVar3;
  TValue *io;
  lua_Integer ic;
  lua_Integer ib;
  TValue *rc_local;
  TValue *rb_local;
  TValue *ra_local;
  lua_State *L_local;
  
  ib = (lua_Integer)rc;
  rc_local = rb;
  rb_local = ra;
  ra_local = (TValue *)L;
  if (rb->tt_ == 0x13) {
    if (rb->tt_ != 0x13) {
      __assert_fail("((((rb))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xc19,"void raviV_op_shl(lua_State *, TValue *, TValue *, TValue *)");
    }
    ic = (rb->value_).i;
LAB_00160141:
    if (*(short *)(ib + 8) == 0x13) {
      if (*(short *)(ib + 8) != 0x13) {
        __assert_fail("((((rc))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc19,"void raviV_op_shl(lua_State *, TValue *, TValue *, TValue *)");
      }
      io = *(TValue **)ib;
    }
    else {
      iVar2 = luaV_tointegerns((TValue *)ib,(lua_Integer *)&io,F2Ieq);
      if (iVar2 == 0) goto LAB_001601ce;
    }
    pTVar1 = rb_local;
    lVar3 = luaV_shiftl(ic,(lua_Integer)io);
    (pTVar1->value_).i = lVar3;
    pTVar1->tt_ = 0x13;
  }
  else {
    iVar2 = luaV_tointegerns(rb,&ic,F2Ieq);
    if (iVar2 != 0) goto LAB_00160141;
LAB_001601ce:
    luaT_trybinTM((lua_State *)ra_local,rc_local,(TValue *)ib,rb_local,TM_SHL);
  }
  return;
}

Assistant:

void raviV_op_shl(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, luaV_shiftl(ib, ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_SHL);
  }
}